

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int store_unique_xor(__m128i old,__m128i newval,uint16_t *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 uStack_1a8;
  __m128i val;
  __m128i key;
  int numberofnewvalues;
  int M;
  __m128i equalleftoright;
  __m128i equalright;
  __m128i equalleft;
  __m128i vecTmp2;
  __m128i vecTmp1;
  uint16_t *output_local;
  __m128i newval_local;
  __m128i old_local;
  ulong uStack_a0;
  
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar1 = vpalignr_avx(auVar1,auVar3,0xc);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar2 = vpalignr_avx(auVar2,auVar4,0xe);
  auVar1 = vpcmpeqw_avx(auVar2,auVar1);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = in_XMM1_Qa;
  auVar3 = vpcmpeqw_avx(auVar2,auVar5);
  auVar1 = vpor_avx(auVar1,auVar3);
  uStack_a0 = SUB168(ZEXT816(0),4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uStack_a0;
  auVar1 = vpacksswb_avx(auVar1,auVar6 << 0x40);
  uVar7 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar1[0xf] >> 7) << 0xf);
  auVar1 = vlddqu_avx(*(undefined1 (*) [16])(uniqshuf + (long)(int)uVar7 * 0x10));
  auVar1 = vpshufb_avx(auVar2,auVar1);
  uStack_1a8 = auVar1._0_8_;
  val[0] = auVar1._8_8_;
  *(undefined8 *)old[0] = uStack_1a8;
  *(longlong *)(old[0] + 8) = val[0];
  return 8 - POPCOUNT(uVar7);
}

Assistant:

static inline int store_unique_xor(__m128i old, __m128i newval,
                                   uint16_t *output) {
    __m128i vecTmp1 = _mm_alignr_epi8(newval, old, 16 - 4);
    __m128i vecTmp2 = _mm_alignr_epi8(newval, old, 16 - 2);
    __m128i equalleft = _mm_cmpeq_epi16(vecTmp2, vecTmp1);
    __m128i equalright = _mm_cmpeq_epi16(vecTmp2, newval);
    __m128i equalleftoright = _mm_or_si128(equalleft, equalright);
    int M = _mm_movemask_epi8(
        _mm_packs_epi16(equalleftoright, _mm_setzero_si128()));
    int numberofnewvalues = 8 - _mm_popcnt_u32(M);
    __m128i key = _mm_lddqu_si128((const __m128i *)uniqshuf + M);
    __m128i val = _mm_shuffle_epi8(vecTmp2, key);
    _mm_storeu_si128((__m128i *)output, val);
    return numberofnewvalues;
}